

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  size_type sVar1;
  reference pvVar2;
  ostream *poVar3;
  value_type *pvVar4;
  void *this;
  exception *ex;
  int *ptr_2;
  int *ptr_1;
  int i_1;
  int *ptr;
  int i;
  plain_bonsai_map<int> map;
  int num_keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  *in_stack_fffffffffffffb50;
  allocator_type *in_stack_fffffffffffffb68;
  allocator<char> *in_stack_fffffffffffffb70;
  allocator<char> *__a;
  iterator in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  string *local_428;
  allocator<char> local_379;
  string local_378 [32];
  value_type *local_358;
  undefined4 local_34c;
  int *local_348;
  int local_33c;
  value_type *local_338;
  int local_32c;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  local_328;
  int local_17c;
  undefined1 local_175;
  allocator<char> local_174;
  allocator<char> local_173;
  allocator<char> local_172;
  allocator<char> local_171;
  allocator<char> local_170;
  allocator<char> local_16f;
  allocator<char> local_16e;
  allocator<char> local_16d [20];
  allocator<char> local_159;
  string *local_158;
  string local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  string *local_30;
  undefined8 local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  int local_4;
  
  local_4 = 0;
  local_175 = 1;
  local_158 = local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_158 = (string *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_175 = 0;
  local_30 = local_150;
  local_28 = 9;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10c726);
  __l._M_len = (size_type)in_stack_fffffffffffffb80;
  __l._M_array = in_stack_fffffffffffffb78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffb70,__l,in_stack_fffffffffffffb68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10c75a);
  local_428 = (string *)&local_30;
  do {
    local_428 = local_428 + -0x20;
    std::__cxx11::string::~string(local_428);
  } while (local_428 != local_150);
  std::allocator<char>::~allocator(&local_174);
  std::allocator<char>::~allocator(&local_173);
  std::allocator<char>::~allocator(&local_172);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::~allocator(&local_170);
  std::allocator<char>::~allocator(&local_16f);
  std::allocator<char>::~allocator(&local_16e);
  std::allocator<char>::~allocator(local_16d);
  std::allocator<char>::~allocator(&local_159);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_20);
  local_17c = (int)sVar1;
  poplar::
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
  map(in_stack_fffffffffffffb40);
  for (local_32c = 0; local_32c < local_17c; local_32c = local_32c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_20,(long)local_32c);
    local_338 = poplar::
                map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                ::update(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    *local_338 = local_32c + 1;
  }
  local_33c = 0;
  do {
    if (local_17c <= local_33c) {
      __a = &local_379;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,__a);
      pvVar4 = poplar::
               map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
               ::find(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator(&local_379);
      local_358 = pvVar4;
      if (pvVar4 == (value_type *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Hotaru: ");
        in_stack_fffffffffffffb50 =
             (map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
              *)std::ostream::operator<<(poVar3,-1);
        std::ostream::operator<<(in_stack_fffffffffffffb50,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"#keys = ");
        in_stack_fffffffffffffb40 =
             (map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
              *)poplar::
                map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                ::size(&local_328);
        this = (void *)std::ostream::operator<<(poVar3,(ulong)in_stack_fffffffffffffb40);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
LAB_0010ce62:
      local_34c = 1;
      poplar::
      map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
      ::~map(in_stack_fffffffffffffb40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb50);
      return local_4;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_20,(long)local_33c);
    local_348 = poplar::
                map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                ::find(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    if ((local_348 == (value_type *)0x0) || (*local_348 != local_33c + 1)) {
      local_4 = 1;
      goto LAB_0010ce62;
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_20,(long)local_33c);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pvVar2);
    in_stack_fffffffffffffb80 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(poVar3,": ");
    in_stack_fffffffffffffb78 =
         (iterator)std::ostream::operator<<(in_stack_fffffffffffffb80,*local_348);
    std::ostream::operator<<(in_stack_fffffffffffffb78,std::endl<char,std::char_traits<char>>);
    local_33c = local_33c + 1;
  } while( true );
}

Assistant:

int main() {
    std::vector<std::string> keys = {"Aoba", "Yun", "Hajime", "Hihumi", "Kou", "Rin", "Hazuki", "Umiko", "Nene"};
    const auto num_keys = static_cast<int>(keys.size());

    poplar::plain_bonsai_map<int> map;

    try {
        for (int i = 0; i < num_keys; ++i) {
            int* ptr = map.update(keys[i]);
            *ptr = i + 1;
        }
        for (int i = 0; i < num_keys; ++i) {
            const int* ptr = map.find(keys[i]);
            if (ptr == nullptr or *ptr != i + 1) {
                return 1;
            }
            std::cout << keys[i] << ": " << *ptr << std::endl;
        }
        {
            const int* ptr = map.find("Hotaru");
            if (ptr != nullptr) {
                return 1;
            }
            std::cout << "Hotaru: " << -1 << std::endl;
        }
    } catch (const poplar::exception& ex) {
        std::cerr << ex.what() << std::endl;
        return 1;
    }

    std::cout << "#keys = " << map.size() << std::endl;

    return 0;
}